

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O2

ScenarioLowerBound * __thiscall
despot::SimpleRockSample::CreateScenarioLowerBound
          (SimpleRockSample *this,string *name,string *particle_bound_name)

{
  bool bVar1;
  TrivialParticleLowerBound *this_00;
  ScenarioLowerBound *this_01;
  ParticleLowerBound *bound;
  ostream *poVar2;
  string asStack_38 [32];
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if ((!bVar1) && (bVar1 = std::operator==(name,"DEFAULT"), !bVar1)) {
    bVar1 = std::operator==(name,"EAST");
    if (bVar1) {
      this_01 = (ScenarioLowerBound *)operator_new(0x20);
      std::__cxx11::string::string(asStack_38,(string *)particle_bound_name);
      bound = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,asStack_38);
      SimpleRockSampleEastPolicy::SimpleRockSampleEastPolicy
                ((SimpleRockSampleEastPolicy *)this_01,&this->super_DSPOMDP,bound);
      std::__cxx11::string::~string(asStack_38);
      return this_01;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported lower bound algorithm: ");
    poVar2 = std::operator<<(poVar2,(string *)name);
    std::endl<char,std::char_traits<char>>(poVar2);
    exit(0);
  }
  this_00 = (TrivialParticleLowerBound *)operator_new(0x10);
  despot::TrivialParticleLowerBound::TrivialParticleLowerBound(this_00,&this->super_DSPOMDP);
  return (ScenarioLowerBound *)this_00;
}

Assistant:

ScenarioLowerBound* SimpleRockSample::CreateScenarioLowerBound(string name,
	string particle_bound_name) const {
	ScenarioLowerBound* bound = NULL;
	if (name == "TRIVIAL" || name == "DEFAULT") {
		bound = new TrivialParticleLowerBound(this);
	} else if (name == "EAST") {
		bound = new SimpleRockSampleEastPolicy(this,
			CreateParticleLowerBound(particle_bound_name));
	} else {
		cerr << "Unsupported lower bound algorithm: " << name << endl;
		exit(0);
	}
	return bound;
}